

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

DynamicTypeHandler * __thiscall
Js::SimpleTypeHandler<1UL>::ConvertToTypeWithItemAttributes
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance)

{
  bool bVar1;
  ES5ArrayTypeHandler *pEVar2;
  DictionaryTypeHandler *pDVar3;
  
  bVar1 = JavascriptArray::IsNonES5Array(instance);
  if (bVar1) {
    pEVar2 = ConvertToES5ArrayType(this,instance);
    return (DynamicTypeHandler *)pEVar2;
  }
  pDVar3 = ConvertToDictionaryType(this,instance);
  return &pDVar3->super_DynamicTypeHandler;
}

Assistant:

DynamicTypeHandler* SimpleTypeHandler<size>::ConvertToTypeWithItemAttributes(DynamicObject* instance)
    {
        return JavascriptArray::IsNonES5Array(instance) ?
            ConvertToES5ArrayType(instance) : ConvertToDictionaryType(instance);
    }